

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

void close_func(LexState *ls)

{
  lua_State *L_00;
  FuncState *fs_00;
  Proto *pPVar1;
  Instruction *pIVar2;
  int *piVar3;
  TValue *pTVar4;
  Proto **ppPVar5;
  LocVar *pLVar6;
  Upvaldesc *pUVar7;
  Proto *f;
  FuncState *fs;
  lua_State *L;
  LexState *ls_local;
  
  L_00 = ls->L;
  fs_00 = ls->fs;
  pPVar1 = fs_00->f;
  luaK_ret(fs_00,0,0);
  leaveblock(fs_00);
  if (0x3fffffffffffffff < (ulong)(long)(fs_00->pc + 1)) {
    luaM_toobig(L_00);
  }
  pIVar2 = (Instruction *)
           luaM_realloc_(L_00,pPVar1->code,(long)pPVar1->sizecode << 2,(long)fs_00->pc << 2);
  pPVar1->code = pIVar2;
  pPVar1->sizecode = fs_00->pc;
  if (0x3fffffffffffffff < (ulong)(long)(fs_00->pc + 1)) {
    luaM_toobig(L_00);
  }
  piVar3 = (int *)luaM_realloc_(L_00,pPVar1->lineinfo,(long)pPVar1->sizelineinfo << 2,
                                (long)fs_00->pc << 2);
  pPVar1->lineinfo = piVar3;
  pPVar1->sizelineinfo = fs_00->pc;
  if (0xfffffffffffffff < (ulong)(long)(fs_00->nk + 1)) {
    luaM_toobig(L_00);
  }
  pTVar4 = (TValue *)luaM_realloc_(L_00,pPVar1->k,(long)pPVar1->sizek << 4,(long)fs_00->nk << 4);
  pPVar1->k = pTVar4;
  pPVar1->sizek = fs_00->nk;
  if (0x1fffffffffffffff < (ulong)(long)(fs_00->np + 1)) {
    luaM_toobig(L_00);
  }
  ppPVar5 = (Proto **)luaM_realloc_(L_00,pPVar1->p,(long)pPVar1->sizep << 3,(long)fs_00->np << 3);
  pPVar1->p = ppPVar5;
  pPVar1->sizep = fs_00->np;
  if (0xfffffffffffffff < (ulong)(long)(fs_00->nlocvars + 1)) {
    luaM_toobig(L_00);
  }
  pLVar6 = (LocVar *)
           luaM_realloc_(L_00,pPVar1->locvars,(long)pPVar1->sizelocvars << 4,
                         (long)fs_00->nlocvars << 4);
  pPVar1->locvars = pLVar6;
  pPVar1->sizelocvars = (int)fs_00->nlocvars;
  if (0xfffffffffffffff < (ulong)(long)(int)(fs_00->nups + 1)) {
    luaM_toobig(L_00);
  }
  pUVar7 = (Upvaldesc *)
           luaM_realloc_(L_00,pPVar1->upvalues,(long)pPVar1->sizeupvalues << 4,
                         (ulong)fs_00->nups << 4);
  pPVar1->upvalues = pUVar7;
  pPVar1->sizeupvalues = (uint)fs_00->nups;
  ls->fs = fs_00->prev;
  anchor_token(ls);
  L_00->top = L_00->top + -1;
  if (0 < L_00->l_G->GCdebt) {
    luaC_step(L_00);
  }
  return;
}

Assistant:

static void close_func (LexState *ls) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Proto *f = fs->f;
  luaK_ret(fs, 0, 0);  /* final return */
  leaveblock(fs);
  luaM_reallocvector(L, f->code, f->sizecode, fs->pc, Instruction);
  f->sizecode = fs->pc;
  luaM_reallocvector(L, f->lineinfo, f->sizelineinfo, fs->pc, int);
  f->sizelineinfo = fs->pc;
  luaM_reallocvector(L, f->k, f->sizek, fs->nk, TValue);
  f->sizek = fs->nk;
  luaM_reallocvector(L, f->p, f->sizep, fs->np, Proto *);
  f->sizep = fs->np;
  luaM_reallocvector(L, f->locvars, f->sizelocvars, fs->nlocvars, LocVar);
  f->sizelocvars = fs->nlocvars;
  luaM_reallocvector(L, f->upvalues, f->sizeupvalues, fs->nups, Upvaldesc);
  f->sizeupvalues = fs->nups;
  lua_assert(fs->bl == NULL);
  ls->fs = fs->prev;
  /* last token read was anchored in defunct function; must re-anchor it */
  anchor_token(ls);
  L->top--;  /* pop table of constants */
  luaC_checkGC(L);
}